

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void object_copy_amt(object *dest,object *src,wchar_t amt)

{
  _Bool _Var1;
  int iVar2;
  wchar_t max_time;
  wchar_t charge_time;
  wchar_t amt_local;
  object *src_local;
  object *dest_local;
  
  iVar2 = randcalc(src->time,0,AVERAGE);
  object_copy(dest,src);
  dest->number = (uint8_t)amt;
  dest->note = src->note;
  _Var1 = tval_can_have_charges(src);
  if (_Var1) {
    dest->pval = (int16_t)((src->pval * amt) / (int)(uint)src->number);
  }
  _Var1 = tval_can_have_timeout(src);
  if (_Var1) {
    if (iVar2 * amt < (int)src->timeout) {
      dest->timeout = (int16_t)(iVar2 * amt);
    }
    else {
      dest->timeout = src->timeout;
    }
  }
  return;
}

Assistant:

void object_copy_amt(struct object *dest, struct object *src, int amt)
{
	int charge_time = randcalc(src->time, 0, AVERAGE), max_time;

	/* Get a copy of the object */
	object_copy(dest, src);

	/* Modify quantity */
	dest->number = amt;
	dest->note = src->note;

	/*
	 * If the item has charges/timeouts, set them to the correct level
	 * too. We split off the same amount as distribute_charges.
	 */
	if (tval_can_have_charges(src))
		dest->pval = src->pval * amt / src->number;

	if (tval_can_have_timeout(src)) {
		max_time = charge_time * amt;

		if (src->timeout > max_time)
			dest->timeout = max_time;
		else
			dest->timeout = src->timeout;
	}
}